

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestCustomOptions_Test::
~ConvertDescriptorToTypeTest_TestCustomOptions_Test
          (ConvertDescriptorToTypeTest_TestCustomOptions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestCustomOptions) {
  Type type = ConvertDescriptorToType(
      kUrlPrefix,
      *proto2_unittest::TestMessageWithCustomOptions::GetDescriptor());
  EXPECT_TRUE(
      HasInt32Option(type.options(), "proto2_unittest.message_opt1", -56));
  const Field* field = FindField(type, "field1");
  ASSERT_TRUE(field != nullptr);
  EXPECT_TRUE(HasUInt64Option(field->options(), "proto2_unittest.field_opt1",
                              8765432109));
}